

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O3

bool wallet::LoadCryptedKey(CWallet *pwallet,DataStream *ssKey,DataStream *ssValue,string *strErr)

{
  pointer pbVar1;
  bool bVar2;
  LegacyDataSPKM *this;
  size_t __nbytes;
  pointer pbVar3;
  bool bVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Span<unsigned_char> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchPrivKey;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  uint256 result;
  uint256 checksum;
  CPubKey vchPubKey;
  undefined1 local_158 [16];
  pointer local_148;
  unique_lock<std::recursive_mutex> local_138;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  CPubKey local_d9;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  uint64_t local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_138._M_device = &(pwallet->cs_wallet).super_recursive_mutex;
  local_138._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_138);
  local_d9.vch[0] = 0xff;
  CPubKey::Unserialize<DataStream>(&local_d9,ssKey);
  __nbytes = (ulong)local_d9.vch[0] & 0xfffffffffffffffe;
  if (((char)__nbytes != '\x02') &&
     ((7 < local_d9.vch[0] || (__nbytes = 0xd0, (0xd0U >> (local_d9.vch[0] & 0x1f) & 1) == 0)))) {
    bVar4 = false;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (strErr,0,strErr->_M_string_length,"Error reading wallet database: CPubKey corrupt",
               0x2e);
    goto LAB_001ac46f;
  }
  local_158 = (undefined1  [16])0x0;
  local_148 = (pointer)0x0;
  DataStream::operator>>(ssValue,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158)
  ;
  pbVar1 = (ssValue->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = (ssValue->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start + ssValue->m_read_pos;
  if (pbVar3 == pbVar1) {
LAB_001ac414:
    this = CWallet::GetOrCreateLegacyDataSPKM(pwallet);
    bVar2 = LegacyDataSPKM::LoadCryptedKey
                      (this,&local_d9,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158,
                       pbVar3 != pbVar1);
    bVar4 = true;
    if (!bVar2) {
      bVar4 = false;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (strErr,0,strErr->_M_string_length,
                 "Error reading wallet database: LegacyDataSPKM::LoadCryptedKey failed",0x44);
    }
  }
  else {
    local_f8 = (undefined1  [16])0x0;
    local_108 = (undefined1  [16])0x0;
    DataStream::read(ssValue,(int)local_108,(void *)0x20,__nbytes);
    local_118 = (undefined1  [16])0x0;
    local_128 = (undefined1  [16])0x0;
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    local_88 = (undefined1  [16])0x0;
    local_98 = (undefined1  [16])0x0;
    local_38 = 0;
    CSHA256::CSHA256((CSHA256 *)local_98);
    CSHA256::Write((CSHA256 *)local_98,(uchar *)local_158._0_8_,local_158._8_8_ - local_158._0_8_);
    output.m_size = 0x20;
    output.m_data = local_128;
    CHash256::Finalize((CHash256 *)local_98,output);
    auVar6[0] = -(local_118[0] == local_f8[0]);
    auVar6[1] = -(local_118[1] == local_f8[1]);
    auVar6[2] = -(local_118[2] == local_f8[2]);
    auVar6[3] = -(local_118[3] == local_f8[3]);
    auVar6[4] = -(local_118[4] == local_f8[4]);
    auVar6[5] = -(local_118[5] == local_f8[5]);
    auVar6[6] = -(local_118[6] == local_f8[6]);
    auVar6[7] = -(local_118[7] == local_f8[7]);
    auVar6[8] = -(local_118[8] == local_f8[8]);
    auVar6[9] = -(local_118[9] == local_f8[9]);
    auVar6[10] = -(local_118[10] == local_f8[10]);
    auVar6[0xb] = -(local_118[0xb] == local_f8[0xb]);
    auVar6[0xc] = -(local_118[0xc] == local_f8[0xc]);
    auVar6[0xd] = -(local_118[0xd] == local_f8[0xd]);
    auVar6[0xe] = -(local_118[0xe] == local_f8[0xe]);
    auVar6[0xf] = -(local_118[0xf] == local_f8[0xf]);
    auVar5[0] = -(local_128[0] == local_108[0]);
    auVar5[1] = -(local_128[1] == local_108[1]);
    auVar5[2] = -(local_128[2] == local_108[2]);
    auVar5[3] = -(local_128[3] == local_108[3]);
    auVar5[4] = -(local_128[4] == local_108[4]);
    auVar5[5] = -(local_128[5] == local_108[5]);
    auVar5[6] = -(local_128[6] == local_108[6]);
    auVar5[7] = -(local_128[7] == local_108[7]);
    auVar5[8] = -(local_128[8] == local_108[8]);
    auVar5[9] = -(local_128[9] == local_108[9]);
    auVar5[10] = -(local_128[10] == local_108[10]);
    auVar5[0xb] = -(local_128[0xb] == local_108[0xb]);
    auVar5[0xc] = -(local_128[0xc] == local_108[0xc]);
    auVar5[0xd] = -(local_128[0xd] == local_108[0xd]);
    auVar5[0xe] = -(local_128[0xe] == local_108[0xe]);
    auVar5[0xf] = -(local_128[0xf] == local_108[0xf]);
    auVar5 = auVar5 & auVar6;
    if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) goto LAB_001ac414;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (strErr,0,strErr->_M_string_length,
               "Error reading wallet database: Encrypted key corrupt",0x34);
    bVar4 = false;
  }
  if ((pointer)local_158._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_158._0_8_,(long)local_148 - local_158._0_8_);
  }
LAB_001ac46f:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_138);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool LoadCryptedKey(CWallet* pwallet, DataStream& ssKey, DataStream& ssValue, std::string& strErr)
{
    LOCK(pwallet->cs_wallet);
    try {
        CPubKey vchPubKey;
        ssKey >> vchPubKey;
        if (!vchPubKey.IsValid())
        {
            strErr = "Error reading wallet database: CPubKey corrupt";
            return false;
        }
        std::vector<unsigned char> vchPrivKey;
        ssValue >> vchPrivKey;

        // Get the checksum and check it
        bool checksum_valid = false;
        if (!ssValue.eof()) {
            uint256 checksum;
            ssValue >> checksum;
            if (!(checksum_valid = Hash(vchPrivKey) == checksum)) {
                strErr = "Error reading wallet database: Encrypted key corrupt";
                return false;
            }
        }

        if (!pwallet->GetOrCreateLegacyDataSPKM()->LoadCryptedKey(vchPubKey, vchPrivKey, checksum_valid))
        {
            strErr = "Error reading wallet database: LegacyDataSPKM::LoadCryptedKey failed";
            return false;
        }
    } catch (const std::exception& e) {
        if (strErr.empty()) {
            strErr = e.what();
        }
        return false;
    }
    return true;
}